

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack7_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7f;
  out[1] = *in >> 7 & 0x7f;
  out[2] = *in >> 0xe & 0x7f;
  out[3] = *in >> 0x15 & 0x7f;
  puVar1 = out + 4;
  *puVar1 = *in >> 0x1c;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 7) << 4 | *puVar1;
  out[5] = *puVar2 >> 3 & 0x7f;
  out[6] = *puVar2 >> 10 & 0x7f;
  out[7] = *puVar2 >> 0x11 & 0x7f;
  out[8] = *puVar2 >> 0x18 & 0x7f;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 0x1f;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0x3f) << 1 | *puVar1;
  out[10] = *puVar2 >> 6 & 0x7f;
  out[0xb] = *puVar2 >> 0xd & 0x7f;
  out[0xc] = *puVar2 >> 0x14 & 0x7f;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x1b;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 3) << 5 | *puVar1;
  out[0xe] = *puVar2 >> 2 & 0x7f;
  out[0xf] = *puVar2 >> 9 & 0x7f;
  out[0x10] = *puVar2 >> 0x10 & 0x7f;
  out[0x11] = *puVar2 >> 0x17 & 0x7f;
  puVar1 = out + 0x12;
  *puVar1 = *puVar2 >> 0x1e;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 0x1f) << 2 | *puVar1;
  out[0x13] = *puVar2 >> 5 & 0x7f;
  out[0x14] = *puVar2 >> 0xc & 0x7f;
  out[0x15] = *puVar2 >> 0x13 & 0x7f;
  puVar1 = out + 0x16;
  *puVar1 = *puVar2 >> 0x1a;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 1) << 6 | *puVar1;
  out[0x17] = *puVar2 >> 1 & 0x7f;
  out[0x18] = *puVar2 >> 8 & 0x7f;
  out[0x19] = *puVar2 >> 0xf & 0x7f;
  out[0x1a] = *puVar2 >> 0x16 & 0x7f;
  puVar1 = out + 0x1b;
  *puVar1 = *puVar2 >> 0x1d;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 0xf) << 3 | *puVar1;
  out[0x1c] = *puVar2 >> 4 & 0x7f;
  out[0x1d] = *puVar2 >> 0xb & 0x7f;
  out[0x1e] = *puVar2 >> 0x12 & 0x7f;
  out[0x1f] = *puVar2 >> 0x19;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack7_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;
  *out = ((*in) >> 24) % (1U << 7);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 6)) << (7 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 7);
  out++;
  *out = ((*in) >> 13) % (1U << 7);
  out++;
  *out = ((*in) >> 20) % (1U << 7);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 2)) << (7 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 7);
  out++;
  *out = ((*in) >> 9) % (1U << 7);
  out++;
  *out = ((*in) >> 16) % (1U << 7);
  out++;
  *out = ((*in) >> 23) % (1U << 7);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 5)) << (7 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 7);
  out++;
  *out = ((*in) >> 12) % (1U << 7);
  out++;
  *out = ((*in) >> 19) % (1U << 7);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 1)) << (7 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 7);
  out++;
  *out = ((*in) >> 8) % (1U << 7);
  out++;
  *out = ((*in) >> 15) % (1U << 7);
  out++;
  *out = ((*in) >> 22) % (1U << 7);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 4)) << (7 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 7);
  out++;
  *out = ((*in) >> 11) % (1U << 7);
  out++;
  *out = ((*in) >> 18) % (1U << 7);
  out++;
  *out = ((*in) >> 25);
  ++in;
  out++;

  return in;
}